

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O2

size_t release_unused_segments(mstate m)

{
  tbinptr pmVar1;
  long *plVar2;
  char *__addr;
  size_t __len;
  malloc_segment *pmVar3;
  malloc_tree_chunk *pmVar4;
  uint uVar5;
  long lVar6;
  char *pcVar7;
  tbinptr pmVar8;
  malloc_tree_chunk **ppmVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  malloc_tree_chunk *pmVar13;
  tbinptr pmVar14;
  ulong uVar15;
  malloc_segment *pmVar16;
  byte bVar17;
  malloc_tree_chunk **ppmVar18;
  long lVar19;
  size_t sVar20;
  uint uVar21;
  malloc_segment *local_48;
  
  local_48 = &_gm_.seg;
  uVar21 = 0;
  sVar20 = 0;
  pmVar3 = _gm_.seg.next;
  pmVar16 = local_48;
LAB_00105983:
  do {
    do {
      do {
        local_48 = pmVar16;
        pmVar16 = pmVar3;
        if (pmVar16 == (malloc_segment *)0x0) {
          _gm_.release_checks = 0xfff;
          if (0xfff < uVar21) {
            _gm_.release_checks = (size_t)uVar21;
          }
          return sVar20;
        }
        __addr = pmVar16->base;
        __len = pmVar16->size;
        pmVar3 = pmVar16->next;
        uVar21 = uVar21 + 1;
      } while ((pmVar16->sflags & 9) != 1);
      uVar12 = (ulong)(-(int)__addr - 0x10U & 0xf);
      pmVar1 = (tbinptr)(__addr + uVar12);
      uVar12 = *(ulong *)(__addr + uVar12 + 8);
      uVar15 = uVar12 & 0xfffffffffffffff8;
    } while ((((uint)uVar12 & 3) != 1) ||
            ((char *)((long)&pmVar1->prev_foot + uVar15) < __addr + (__len - 0x50)));
    if (pmVar1 == (tbinptr)_gm_.dv) {
      _gm_.dv = (mchunkptr)0x0;
      _gm_.dvsize = 0;
    }
    else {
      pmVar14 = pmVar1->bk;
      pmVar13 = pmVar1->parent;
      if (pmVar14 == pmVar1) {
        if (pmVar1->child[1] == (tbinptr)0x0) {
          if (pmVar1->child[0] == (tbinptr)0x0) {
            pmVar14 = (tbinptr)0x0;
            goto LAB_00105a9e;
          }
          pmVar8 = pmVar1->child[0];
          ppmVar9 = pmVar1->child;
        }
        else {
          pmVar8 = pmVar1->child[1];
          ppmVar9 = pmVar1->child + 1;
        }
        do {
          do {
            ppmVar18 = ppmVar9;
            pmVar14 = pmVar8;
            pmVar8 = pmVar14->child[1];
            ppmVar9 = pmVar14->child + 1;
          } while (pmVar14->child[1] != (malloc_tree_chunk *)0x0);
          pmVar8 = pmVar14->child[0];
          ppmVar9 = pmVar14->child;
        } while (pmVar14->child[0] != (malloc_tree_chunk *)0x0);
        if (ppmVar18 < _gm_.least_addr) goto LAB_00105ccb;
        *ppmVar18 = (malloc_tree_chunk *)0x0;
      }
      else {
        pmVar4 = pmVar1->fd;
        if (((pmVar4 < _gm_.least_addr) || (pmVar4->bk != pmVar1)) || (pmVar14->fd != pmVar1))
        goto LAB_00105ccb;
        pmVar4->bk = pmVar14;
        pmVar14->fd = pmVar4;
      }
LAB_00105a9e:
      if (pmVar13 != (malloc_tree_chunk *)0x0) {
        uVar11 = pmVar1->index;
        if (pmVar1 == _gm_.treebins[uVar11]) {
          _gm_.treebins[uVar11] = pmVar14;
          if (pmVar14 == (tbinptr)0x0) {
            bVar17 = (byte)uVar11 & 0x1f;
            _gm_.treemap = _gm_.treemap & (-2 << bVar17 | 0xfffffffeU >> 0x20 - bVar17);
          }
          else {
LAB_00105aeb:
            pcVar7 = _gm_.least_addr;
            if (pmVar14 < _gm_.least_addr) goto LAB_00105ccb;
            pmVar14->parent = pmVar13;
            pmVar13 = pmVar1->child[0];
            if (pmVar13 != (malloc_tree_chunk *)0x0) {
              if (pmVar13 < pcVar7) goto LAB_00105ccb;
              pmVar14->child[0] = pmVar13;
              pmVar13->parent = pmVar14;
            }
            pmVar13 = pmVar1->child[1];
            if (pmVar13 != (malloc_tree_chunk *)0x0) {
              if (pmVar13 < pcVar7) goto LAB_00105ccb;
              pmVar14->child[1] = pmVar13;
              pmVar13->parent = pmVar14;
            }
          }
        }
        else {
          if (pmVar13 < _gm_.least_addr) goto LAB_00105ccb;
          pmVar13->child[pmVar13->child[0] != pmVar1] = pmVar14;
          if (pmVar14 != (tbinptr)0x0) goto LAB_00105aeb;
        }
      }
    }
    iVar10 = munmap(__addr,__len);
    if (iVar10 == 0) {
      _gm_.footprint = _gm_.footprint - __len;
      sVar20 = sVar20 + __len;
      local_48->next = pmVar3;
      pmVar16 = local_48;
      goto LAB_00105983;
    }
    uVar11 = (uint)(uVar12 >> 8);
    if (uVar11 == 0) {
      uVar12 = 0;
    }
    else {
      uVar12 = 0x1f;
      if (uVar11 < 0x10000) {
        uVar5 = 0x1f;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar12 = (ulong)((uint)((uVar15 >> ((ulong)(byte)(0x26 - (char)(uVar5 ^ 0x1f)) & 0x3f) & 1)
                               != 0) + (uVar5 ^ 0x1f) * 2 ^ 0x3e);
      }
    }
    uVar11 = (uint)uVar12;
    pmVar13 = (malloc_tree_chunk *)(_gm_.treebins + uVar12);
    pmVar1->index = uVar11;
    pmVar1->child[0] = (malloc_tree_chunk *)0x0;
    pmVar1->child[1] = (malloc_tree_chunk *)0x0;
    if ((_gm_.treemap >> (uVar11 & 0x1f) & 1) == 0) {
      _gm_.treemap = _gm_.treemap | 1 << ((byte)uVar12 & 0x1f);
      pmVar13->prev_foot = (size_t)pmVar1;
    }
    else {
      bVar17 = 0x39 - (char)(uVar12 >> 1);
      if (uVar11 == 0x1f) {
        bVar17 = 0;
      }
      lVar19 = uVar15 << (bVar17 & 0x3f);
      pmVar4 = (malloc_tree_chunk *)pmVar13->prev_foot;
      do {
        pmVar13 = pmVar4;
        if ((pmVar13->head & 0xfffffffffffffff8) == uVar15) {
          if ((pmVar13 < _gm_.least_addr) || (pmVar4 = pmVar13->fd, pmVar4 < _gm_.least_addr))
          goto LAB_00105ccb;
          pmVar4->bk = pmVar1;
          pmVar13->fd = pmVar1;
          pmVar1->fd = pmVar4;
          pmVar1->bk = pmVar13;
          pmVar1->parent = (malloc_tree_chunk *)0x0;
          goto LAB_00105983;
        }
        lVar6 = lVar19 >> 0x3f;
        lVar19 = lVar19 * 2;
        pmVar4 = *(malloc_tree_chunk **)((long)pmVar13 + lVar6 * -8 + 0x20);
      } while (pmVar4 != (malloc_tree_chunk *)0x0);
      plVar2 = (long *)((long)pmVar13 + lVar6 * -8 + 0x20);
      if (plVar2 < _gm_.least_addr) {
LAB_00105ccb:
        abort();
      }
      *plVar2 = (long)pmVar1;
    }
    pmVar1->parent = pmVar13;
    pmVar1->bk = pmVar1;
    pmVar1->fd = pmVar1;
  } while( true );
}

Assistant:

static size_t release_unused_segments(mstate m) {
  size_t released = 0;
  int nsegs = 0;
  msegmentptr pred = &m->seg;
  msegmentptr sp = pred->next;
  while (sp != 0) {
    char* base = sp->base;
    size_t size = sp->size;
    msegmentptr next = sp->next;
    ++nsegs;
    if (is_mmapped_segment(sp) && !is_extern_segment(sp)) {
      mchunkptr p = align_as_chunk(base);
      size_t psize = chunksize(p);
      /* Can unmap if first chunk holds entire segment and not pinned */
      if (!is_inuse(p) && (char*)p + psize >= base + size - TOP_FOOT_SIZE) {
        tchunkptr tp = (tchunkptr)p;
        assert(segment_holds(sp, (char*)sp));
        if (p == m->dv) {
          m->dv = 0;
          m->dvsize = 0;
        }
        else {
          unlink_large_chunk(m, tp);
        }
        if (CALL_MUNMAP(base, size) == 0) {
          released += size;
          m->footprint -= size;
          /* unlink obsoleted record */
          sp = pred;
          sp->next = next;
        }
        else { /* back out if cannot unmap */
          insert_large_chunk(m, tp, psize);
        }
      }
    }
    if (NO_SEGMENT_TRAVERSAL) /* scan only first segment */
      break;
    pred = sp;
    sp = next;
  }
  /* Reset check counter */
  m->release_checks = (((size_t) nsegs > (size_t) MAX_RELEASE_CHECK_RATE)?
                       (size_t) nsegs : (size_t) MAX_RELEASE_CHECK_RATE);
  return released;
}